

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

string * __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::AppendStructBuilderBody
          (string *__return_storage_ptr__,LuaBfbsGenerator *this,Object *object,string *prefix)

{
  long *plVar1;
  undefined8 *puVar2;
  ushort uVar3;
  long *plVar4;
  ulong *puVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  LuaBfbsGenerator *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  string local_50;
  
  local_108 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar6 = 0;
  uVar3 = 0;
  if (10 < *(ushort *)(object + -(long)*(int *)object)) {
    uVar3 = *(ushort *)(object + (10 - (long)*(int *)object));
  }
  if (uVar3 != 0) {
    iVar6 = *(int *)(object + uVar3);
  }
  NumToString<int>(&local_50,iVar6);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x389b50);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_88 = *plVar4;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar4;
    local_98 = (long *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_f0 = *puVar5;
    lStack_e8 = plVar1[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar5;
    local_100 = (ulong *)*plVar1;
  }
  local_f8 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  iVar6 = 0;
  uVar3 = 0;
  if (0xc < *(ushort *)(object + -(long)*(int *)object)) {
    uVar3 = *(ushort *)(object + (0xc - (long)*(int *)object));
  }
  if (uVar3 != 0) {
    iVar6 = *(int *)(object + uVar3);
  }
  NumToString<int>(&local_e0,iVar6);
  uVar7 = 0xf;
  if (local_100 != &local_f0) {
    uVar7 = local_f0;
  }
  local_a0 = this;
  if (uVar7 < local_e0._M_string_length + local_f8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar8 = local_e0.field_2._M_allocated_capacity;
    }
    if (local_e0._M_string_length + local_f8 <= (ulong)uVar8) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
      goto LAB_00328fb0;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
LAB_00328fb0:
  local_128 = &local_118;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_118 = *plVar1;
    uStack_110 = puVar2[3];
  }
  else {
    local_118 = *plVar1;
    local_128 = (long *)*puVar2;
  }
  local_120 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_128);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_b0 = *plVar4;
    lStack_a8 = plVar1[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*plVar1;
  }
  local_b8 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(string **)local_78._M_unused._0_8_ = __return_storage_ptr__;
  *(LuaBfbsGenerator **)((long)local_78._M_unused._0_8_ + 8) = local_a0;
  *(string **)((long)local_78._M_unused._0_8_ + 0x10) = prefix;
  pcStack_60 = std::
               _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_lua.cpp:490:44)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_lua.cpp:490:44)>
             ::_M_manager;
  BaseBfbsGenerator::ForAllFields
            (&local_a0->super_BaseBfbsGenerator,object,true,
             (function<void_(const_reflection::Field_*)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AppendStructBuilderBody(const r::Object *object,
                                      std::string prefix = "") const {
    std::string code;
    code += "  builder:Prep(" + NumToString(object->minalign()) + ", " +
            NumToString(object->bytesize()) + ")\n";

    // We need to reverse the order we iterate over, since we build the
    // buffer backwards.
    ForAllFields(object, /*reverse=*/true, [&](const r::Field *field) {
      const int32_t num_padding_bytes = field->padding();
      if (num_padding_bytes) {
        code += "  builder:Pad(" + NumToString(num_padding_bytes) + ")\n";
      }
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        code += AppendStructBuilderBody(field_object,
                                        prefix + namer_.Variable(*field) + "_");
      } else {
        code += "  builder:Prepend" + GenerateMethod(field) + "(" + prefix +
                namer_.Variable(*field) + ")\n";
      }
    });

    return code;
  }